

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_parser.c
# Opt level: O3

HT_ErrorCode print_help(int argc,char **argv,int pos)

{
  char *pcVar1;
  char *pcVar2;
  
  puts("HawkTracer options:");
  pcVar2 = "      ";
  pcVar1 = "      ";
  if (arguments[0].is_flag == 0) {
    pcVar1 = "VALUE";
  }
  printf("  %s %s   %s\n",arguments[0].argument,pcVar1,arguments[0].help);
  if (arguments[1].is_flag == 0) {
    pcVar2 = "VALUE";
  }
  printf("  %s %s   %s\n",arguments[1].argument,pcVar2,arguments[1].help);
  exit(0);
}

Assistant:

static HT_ErrorCode
print_help(int argc, char** argv, int pos)
{
    HT_UNUSED(argc);
    HT_UNUSED(argv);
    HT_UNUSED(pos);

    printf("HawkTracer options:\n");

    for (unsigned int x = 0; x < sizeof(arguments) / sizeof(arguments[0]); x++)
    {
        printf("  %s %s   %s\n",
            arguments[x].argument,
            arguments[x].is_flag ? "      " : "VALUE",
            arguments[x].help);
    }

    exit(0);

    return HT_ERR_OK;
}